

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O0

void munmap_checked(void *addr,size_t size)

{
  int iVar1;
  int *piVar2;
  intptr_t ignore_it;
  char buf [64];
  size_t size_local;
  void *addr_local;
  
  buf._56_8_ = size;
  iVar1 = munmap(addr,size);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    strerror_r(*piVar2,(char *)&ignore_it,0x40);
    fprintf(_stderr,"Error in munmap(%p, %zu): %s\n",addr,buf._56_8_,&ignore_it);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                  ,0x53,"void munmap_checked(void *, size_t)");
  }
  return;
}

Assistant:

static void
munmap_checked(void *addr, size_t size)
{
	if (munmap(addr, size)) {
		char buf[64];
		intptr_t ignore_it = (intptr_t)strerror_r(errno, buf,
							  sizeof(buf));
		(void)ignore_it;
		fprintf(stderr, "Error in munmap(%p, %zu): %s\n",
			addr, size, buf);
		assert(false);
	}
}